

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApiDebug.cpp
# Opt level: O2

void __thiscall bintree::updateOnce(bintree *this,vec2 *target)

{
  bool bVar1;
  uint32_t uVar2;
  leb_Node extraout_RDX;
  uint32_t i;
  uint32_t nodeID;
  leb_DiamondParent diamond;
  leb_Node node;
  leb_DiamondParent local_58;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  uVar2 = leb_NodeCount(this->m_leb);
  for (nodeID = 0; uVar2 != nodeID; nodeID = nodeID + 1) {
    node = leb_DecodeNode(this->m_leb,nodeID);
    if (this->m_pingPong == 1) {
      if (g_params.flags.freeze == false) {
        if (g_params.mode == 0) {
          local_58 = leb_DecodeDiamondParent(node);
        }
        else {
          local_58 = leb_DecodeDiamondParent_Quad(node);
        }
        bVar1 = testTarget(this,&local_58.base,target);
        if (!bVar1) {
          bVar1 = testTarget(this,&local_58.top,target);
          if (!bVar1) {
            diamond.top = local_58.top;
            diamond.base = extraout_RDX;
            leb_MergeNodeConforming(this->m_leb,node,diamond);
          }
        }
      }
    }
    else if ((this->m_pingPong == 0) && (g_params.flags.freeze == false)) {
      bVar1 = testTarget(this,&node,target);
      if (bVar1) {
        if (g_params.mode == 0) {
          leb_SplitNodeConforming(this->m_leb,node);
        }
        else {
          leb_SplitNodeConforming_Quad(this->m_leb,node);
        }
      }
    }
  }
  leb_ComputeSumReduction(this->m_leb);
  precomputeNodes((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,this);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_48);
  this->m_pingPong = 1 - this->m_pingPong;
  return;
}

Assistant:

void updateOnce(const dja::vec2 &target)
    {
        uint32_t cnt = leb_NodeCount(m_leb);

        // update
        for (uint32_t i = 0; i < cnt; ++i) {
            leb_Node node = leb_DecodeNode(m_leb, i);

            if /* splitting pass */(m_pingPong == 0 && !g_params.flags.freeze) {
                bool isInside = testTarget(node, target);

                /* split */
                if (isInside) {
                    if (g_params.mode == MODE_TRIANGLE) {
                        leb_SplitNodeConforming(m_leb, node);
                    } else {
                        leb_SplitNodeConforming_Quad(m_leb, node);
                    }
                }
            } else if /* merging pass */(m_pingPong == 1 && !g_params.flags.freeze) {
                leb_DiamondParent diamond;

                if (g_params.mode == MODE_TRIANGLE) {
                    diamond = leb_DecodeDiamondParent(node);
                } else {
                    diamond = leb_DecodeDiamondParent_Quad(node);
                }

                bool shouldMerge = !testTarget(diamond.base, target)
                                 && !testTarget(diamond.top, target);

                if (shouldMerge) {
                    if (g_params.mode == MODE_TRIANGLE) {
                        leb_MergeNodeConforming(m_leb, node, diamond);
                    } else {
                        leb_MergeNodeConforming_Quad(m_leb, node, diamond);
                    }
                }
            }
        }

        leb_ComputeSumReduction(m_leb);

        precomputeNodes();
        m_pingPong = 1 - m_pingPong;
    }